

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBrokerData.cpp
# Opt level: O2

void __thiscall
helics::NetworkBrokerData::checkAndUpdateBrokerAddress
          (NetworkBrokerData *this,string_view localAddress)

{
  InterfaceTypes IVar1;
  bool bVar2;
  int iVar3;
  string *__lhs;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__svt;
  allocator<char> local_41;
  string_view localAddress_local;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30 [2];
  
  localAddress_local._M_str = localAddress._M_str;
  localAddress_local._M_len = localAddress._M_len;
  IVar1 = this->allowedType;
  if (IVar1 == IP) {
    __lhs = &this->brokerAddress;
    bVar2 = std::operator==(__lhs,"udp://*");
    if ((bVar2) || (bVar2 = std::operator==(__lhs,"udp"), bVar2)) {
      pcVar4 = "udp://";
LAB_00269c7d:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_30[0]._M_local_buf,pcVar4,&local_41);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30)
      ;
      std::__cxx11::string::~string((string *)local_30[0]._M_local_buf);
      iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&localAddress_local,3,3,"://");
      if (iVar3 == 0) {
        local_30[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       )CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                                  (&localAddress_local,6,0xffffffffffffffff);
        __svt = local_30;
      }
      else {
        __svt = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&localAddress_local;
      }
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)__lhs,(basic_string_view<char,_std::char_traits<char>_> *)__svt);
      return;
    }
    bVar2 = std::operator==(__lhs,"tcp://*");
    if ((bVar2) || (bVar2 = std::operator==(__lhs,"tcp"), bVar2)) {
      pcVar4 = "tcp://";
      goto LAB_00269c7d;
    }
    pcVar4 = "*";
  }
  else if (IVar1 == UDP) {
    bVar2 = std::operator==(&this->brokerAddress,"udp://*");
    if ((bVar2) || (bVar2 = std::operator==(&this->brokerAddress,"*"), bVar2)) goto LAB_00269cda;
    pcVar4 = "udp";
  }
  else {
    if (IVar1 != TCP) {
      if (localAddress_local._M_len == 0 || (this->brokerAddress)._M_string_length != 0) {
        return;
      }
      goto LAB_00269cda;
    }
    bVar2 = std::operator==(&this->brokerAddress,"tcp://*");
    if ((bVar2) || (bVar2 = std::operator==(&this->brokerAddress,"*"), bVar2)) goto LAB_00269cda;
    pcVar4 = "tcp";
  }
  bVar2 = std::operator==(&this->brokerAddress,pcVar4);
  if (!bVar2) {
    return;
  }
LAB_00269cda:
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->brokerAddress,&localAddress_local);
  return;
}

Assistant:

void NetworkBrokerData::checkAndUpdateBrokerAddress(std::string_view localAddress)
{
    using gmlc::networking::InterfaceTypes;
    switch (allowedType) {
        case InterfaceTypes::TCP:
            if ((brokerAddress == "tcp://*") || (brokerAddress == "*") ||
                (brokerAddress == "tcp")) {  // the broker address can't use a wild card
                brokerAddress = localAddress;
            }
            break;
        case InterfaceTypes::UDP:
            if ((brokerAddress == "udp://*") || (brokerAddress == "*") ||
                (brokerAddress == "udp")) {  // the broker address can't use a wild card
                brokerAddress = localAddress;
            }
            break;
        case InterfaceTypes::IP:
            if ((brokerAddress == "udp://*") ||
                (brokerAddress == "udp")) {  // the broker address can't use a wild card
                brokerAddress = std::string("udp://");
                if (localAddress.compare(3, 3, "://") == 0) {
                    brokerAddress.append(localAddress.substr(6));
                } else {
                    brokerAddress.append(localAddress);
                }
            } else if ((brokerAddress == "tcp://*") ||
                       (brokerAddress == "tcp")) {  // the broker address can't use a wild card
                brokerAddress = std::string("tcp://");
                if (localAddress.compare(3, 3, "://") == 0) {
                    brokerAddress.append(localAddress.substr(6));
                } else {
                    brokerAddress.append(localAddress);
                }
            } else if (brokerAddress == "*") {
                brokerAddress = localAddress;
            }
            break;
        case InterfaceTypes::IPC:
        case InterfaceTypes::INPROC:
        default:
            if ((brokerAddress.empty()) && (!localAddress.empty())) {
                brokerAddress = localAddress;
            }
            break;
    }
}